

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

int Gia_SplitCofVar(Gia_Man_t *p,int LookAhead,int *pnFanouts,int *pnCost)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *__ptr;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pObj;
  int local_58;
  int local_54;
  int iBest;
  int i;
  int *pOrder;
  int CostBest;
  int Cost1;
  int Cost0;
  Gia_Man_t *pPart;
  int *pnCost_local;
  int *pnFanouts_local;
  int LookAhead_local;
  Gia_Man_t *p_local;
  
  pOrder._4_4_ = 1000000000;
  local_58 = -1;
  if (LookAhead == 1) {
    p_local._4_4_ = Gia_SplitCofVar2(p,pnFanouts,pnCost);
  }
  else {
    __ptr = Gia_PermuteSpecialOrder(p);
    iVar1 = Gia_ManPiNum(p);
    iVar1 = Abc_MinInt(LookAhead,iVar1);
    for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
      pGVar4 = Gia_ManDupCofactorVar(p,__ptr[local_54],0);
      iVar2 = Gia_ManAndNum(pGVar4);
      Gia_ManStop(pGVar4);
      pGVar4 = Gia_ManDupCofactorVar(p,__ptr[local_54],1);
      iVar3 = Gia_ManAndNum(pGVar4);
      Gia_ManStop(pGVar4);
      if (iVar2 + iVar3 < pOrder._4_4_) {
        pOrder._4_4_ = iVar2 + iVar3;
        local_58 = __ptr[local_54];
      }
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (local_58 < 0) {
      __assert_fail("iBest >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                    ,0x105,"int Gia_SplitCofVar(Gia_Man_t *, int, int *, int *)");
    }
    pObj = Gia_ManPi(p,local_58);
    iVar1 = Gia_ObjRefNum(p,pObj);
    *pnFanouts = iVar1;
    *pnCost = pOrder._4_4_;
    p_local._4_4_ = local_58;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_SplitCofVar( Gia_Man_t * p, int LookAhead, int * pnFanouts, int * pnCost )
{
    Gia_Man_t * pPart;
    int Cost0, Cost1, CostBest = ABC_INFINITY;
    int * pOrder, i, iBest = -1;
    if ( LookAhead == 1 )
        return Gia_SplitCofVar2( p, pnFanouts, pnCost );
    pOrder = Gia_PermuteSpecialOrder( p );
    LookAhead = Abc_MinInt( LookAhead, Gia_ManPiNum(p) );
    for ( i = 0; i < LookAhead; i++ )
    {
        pPart = Gia_ManDupCofactorVar( p, pOrder[i], 0 );
        Cost0 = Gia_ManAndNum(pPart);
        Gia_ManStop( pPart );

        pPart = Gia_ManDupCofactorVar( p, pOrder[i], 1 );
        Cost1 = Gia_ManAndNum(pPart);
        Gia_ManStop( pPart );

        if ( CostBest > Cost0 + Cost1 )
            CostBest = Cost0 + Cost1, iBest = pOrder[i];

/*
        pPart = Gia_ManDupExist( p, pOrder[i] );
        printf( "%2d : Var = %4d  Refs = %3d  %6d %6d -> %6d    %6d -> %6d\n", 
            i, pOrder[i], Gia_ObjRefNum(p, Gia_ManPi(p, pOrder[i])), 
            Cost0, Cost1, Cost0+Cost1, Gia_ManAndNum(p), Gia_ManAndNum(pPart) );
        Gia_ManStop( pPart );

        printf( "%2d : Var = %4d  Refs = %3d  %6d %6d -> %6d\n", 
            i, pOrder[i], Gia_ObjRefNum(p, Gia_ManPi(p, pOrder[i])), 
            Cost0, Cost1, Cost0+Cost1 );
*/
    }
    ABC_FREE( pOrder );
    assert( iBest >= 0 );
    *pnFanouts = Gia_ObjRefNum(p, Gia_ManPi(p, iBest));
    *pnCost = CostBest;
    return iBest;
}